

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_analysisAndEvaluationEnvironment_create(sysbvm_context_t *context,sysbvm_tuple_t parent)

{
  undefined8 uVar1;
  _Bool _Var2;
  sysbvm_object_tuple_t *psVar3;
  
  psVar3 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).analysisAndEvaluationEnvironmentType,0xd);
  psVar3[2].header.field_0.typePointer = parent;
  if (parent != 0) {
    _Var2 = sysbvm_tuple_isKindOf
                      (context,parent,(context->roots).analysisAndEvaluationEnvironmentType);
    if (_Var2) {
      uVar1 = *(undefined8 *)(parent + 0x50);
      psVar3[3].header.identityHashAndFlags = (int)uVar1;
      psVar3[3].header.objectSize = (int)((ulong)uVar1 >> 0x20);
    }
  }
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_analysisAndEvaluationEnvironment_create(sysbvm_context_t *context, sysbvm_tuple_t parent)
{
    sysbvm_analysisAndEvaluationEnvironment_t *result = (sysbvm_analysisAndEvaluationEnvironment_t*)sysbvm_context_allocatePointerTuple(context, context->roots.analysisAndEvaluationEnvironmentType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_analysisAndEvaluationEnvironment_t));
    result->super.parent = parent;

    // Inherit the analyzer token, if possible.
    if(parent && sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, parent))
        result->analyzerToken = ((sysbvm_analysisAndEvaluationEnvironment_t*)parent)->analyzerToken;
    return (sysbvm_tuple_t)result;
}